

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_ws(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = G->pos;
  iVar4 = G->thunkpos;
  iVar1 = yymatchChar(G,10);
  if ((iVar1 != 0) && (iVar1 = yy_pod(G), iVar1 != 0)) {
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar4;
  iVar1 = yymatchString(G,"\n=begin END\n");
  if (iVar1 != 0) {
    do {
      iVar3 = G->pos;
      if (G->limit <= iVar3) {
        iVar4 = G->thunkpos;
        iVar1 = yyrefill(G);
        if (iVar1 == 0) goto code_r0x00104d47;
      }
      G->pos = G->pos + 1;
    } while( true );
  }
  G->pos = iVar3;
  G->thunkpos = iVar4;
  iVar1 = yymatchChar(G,0x20);
  if (iVar1 != 0) {
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar4;
  iVar1 = yymatchChar(G,0xc);
  if (iVar1 != 0) {
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar4;
  iVar1 = yymatchChar(G,0xb);
  if (iVar1 != 0) {
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar4;
  iVar1 = yymatchChar(G,9);
  if (iVar1 != 0) {
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar4;
  iVar1 = yymatchString(G,anon_var_dwarf_5355);
  if (iVar1 != 0) {
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar4;
  iVar1 = yymatchString(G,anon_var_dwarf_5361);
  if (iVar1 != 0) {
    return 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar4;
  iVar1 = yymatchString(G,"\n=END\n");
  if (iVar1 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar4;
    iVar1 = yy_end_of_line(G);
    if (iVar1 != 0) {
      return 1;
    }
    G->pos = iVar3;
    G->thunkpos = iVar4;
    iVar1 = yy_comment(G);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    do {
      iVar3 = G->pos;
      iVar4 = G->thunkpos;
      iVar2 = yymatchDot(G);
    } while (iVar2 != 0);
  }
LAB_00104d4c:
  G->pos = iVar3;
  G->thunkpos = iVar4;
  return iVar1;
code_r0x00104d47:
  iVar1 = 1;
  goto LAB_00104d4c;
}

Assistant:

YY_RULE(int) yy_ws(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "ws"));

  {  int yypos996= G->pos, yythunkpos996= G->thunkpos;  if (!yymatchChar(G, '\n')) goto l997;
  if (!yy_pod(G))  goto l997;
  goto l996;
  l997:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\n=begin END\n")) goto l998;

  l999:;	
  {  int yypos1000= G->pos, yythunkpos1000= G->thunkpos;  if (!yymatchDot(G)) goto l1000;  goto l999;
  l1000:;	  G->pos= yypos1000; G->thunkpos= yythunkpos1000;
  }  goto l996;
  l998:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, ' ')) goto l1001;
  goto l996;
  l1001:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, '\f')) goto l1002;
  goto l996;
  l1002:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, '\v')) goto l1003;
  goto l996;
  l1003:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, '\t')) goto l1004;
  goto l996;
  l1004:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\205")) goto l1005;
  goto l996;
  l1005:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\240")) goto l1006;
  goto l996;
  l1006:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\n=END\n")) goto l1007;

  l1008:;	
  {  int yypos1009= G->pos, yythunkpos1009= G->thunkpos;  if (!yymatchDot(G)) goto l1009;  goto l1008;
  l1009:;	  G->pos= yypos1009; G->thunkpos= yythunkpos1009;
  }  goto l996;
  l1007:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yy_end_of_line(G))  goto l1010;
  goto l996;
  l1010:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yy_comment(G))  goto l995;

  }
  l996:;	  yyprintf((stderr, "  ok   ws"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l995:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "ws"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}